

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.c
# Opt level: O0

int blob_write_plot(blob_t *blobs,int count,char *filename)

{
  FILE *__stream;
  FILE *__stream_00;
  int *piVar1;
  char *pcVar2;
  int local_3c;
  int j;
  FILE *out;
  int i;
  char *filename_local;
  int count_local;
  blob_t *blobs_local;
  
  __stream_00 = fopen(filename,"wb");
  __stream = _stderr;
  if (__stream_00 == (FILE *)0x0) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    fprintf(__stream,"failed to open %s : %s\n",filename,pcVar2);
    blobs_local._4_4_ = 0;
  }
  else {
    for (out._4_4_ = 0; out._4_4_ < count; out._4_4_ = out._4_4_ + 1) {
      contour_write_plot(&blobs[out._4_4_].external,blobs[out._4_4_].label << 1,(FILE *)__stream_00)
      ;
      fprintf(__stream_00,"\n");
      if (blobs[out._4_4_].internal != (contour_t *)0x0) {
        for (local_3c = 0; local_3c < blobs[out._4_4_].internal_count; local_3c = local_3c + 1) {
          contour_write_plot(blobs[out._4_4_].internal + local_3c,blobs[out._4_4_].label * 2 + 1,
                             (FILE *)__stream_00);
          fprintf(__stream_00,"\n");
        }
      }
    }
    fclose(__stream_00);
    blobs_local._4_4_ = 1;
  }
  return blobs_local._4_4_;
}

Assistant:

int blob_write_plot(blob_t *blobs, int count, const char *filename)
{
    int i;
    FILE *out = fopen(filename, "wb");
    if(NULL == out)
    {
        fprintf(stderr, "failed to open %s : %s\n", filename, strerror(errno));
        return 0;
    }

    for(i=0; i<count; i++)
    {
        contour_write_plot(&blobs[i].external, 2 * blobs[i].label, out);
        fprintf(out, "\n");
        if(NULL != blobs[i].internal)
        {
            int j;
            for(j=0; j<blobs[i].internal_count; j++)
            {
                contour_write_plot(blobs[i].internal + j,  (2 * blobs[i].label) + 1, out);
                fprintf(out, "\n");
            }
        }
    }
    fclose(out);
    return 1;
}